

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O2

bool __thiscall
basisu::etc1_optimizer::evaluate_solution_fast
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  char cVar1;
  uint uVar2;
  params *ppVar3;
  uint *puVar4;
  bool bVar5;
  int iVar6;
  color_rgba cVar7;
  uint32_t uVar8;
  int iVar9;
  uchar *puVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  color_rgba *c1;
  size_t early_out_err;
  vector<unsigned_char> *this_00;
  etc1_optimizer *peVar25;
  uint uVar26;
  color_rgba block_colors [4];
  uint32_t block_inten_midpoints [3];
  uint32_t block_inten [4];
  int64_t block_error;
  
  bVar5 = check_for_redundant_solution(this,coords);
  if (!bVar5) {
    return false;
  }
  ppVar3 = this->m_pParams;
  if (ppVar3->m_constrain_against_base_color5 == true) {
    iVar6 = (uint)(coords->m_unscaled_color).field_0.m_comps[0] -
            (uint)(ppVar3->m_base_color5).field_0.m_comps[0];
    iVar11 = (uint)(coords->m_unscaled_color).field_0.m_comps[1] -
             (uint)(ppVar3->m_base_color5).field_0.m_comps[1];
    iVar15 = (uint)(coords->m_unscaled_color).field_0.m_comps[2] -
             (uint)(ppVar3->m_base_color5).field_0.m_comps[2];
    iVar9 = iVar11;
    if (iVar6 < iVar11) {
      iVar9 = iVar6;
    }
    if (iVar15 <= iVar9) {
      iVar9 = iVar15;
    }
    if (-5 < iVar9) {
      if (iVar11 < iVar6) {
        iVar11 = iVar6;
      }
      if (iVar11 <= iVar15) {
        iVar11 = iVar15;
      }
      if (iVar11 < 4) goto LAB_002229ee;
    }
    trial_solution->m_valid = false;
  }
  else {
LAB_002229ee:
    cVar7 = etc1_solution_coordinates::get_scaled_color(coords);
    uVar2 = this->m_pParams->m_num_src_pixels;
    uVar17 = (ulong)uVar2;
    if ((trial_solution->m_selectors).m_size != uVar2) {
      __assert_fail("trial_solution.m_selectors.size() == n",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                    ,0x519,
                    "bool basisu::etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates &, potential_solution &, potential_solution *)"
                   );
    }
    trial_solution->m_error = 0xffffffffffffffff;
    if ((this->m_pParams->super_basis_etc1_pack_params).m_quality == cETCQualityFast) {
      cVar1 = '\0';
    }
    else {
      cVar1 = (this->m_pParams->super_basis_etc1_pack_params).m_perceptual;
    }
    uVar24 = (uint)cVar7.field_0 >> 0x10 & 0xff;
    this_00 = &this->m_temp_selectors;
    peVar25 = this;
    uVar26 = uVar24;
    for (uVar12 = 7; -1 < (int)uVar12; uVar12 = uVar12 - 1) {
      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
        iVar9 = (&g_etc1_inten_tables)[(ulong)uVar12 * 4 + lVar13];
        uVar20 = iVar9 + ((uint)cVar7.field_0 & 0xff);
        uVar21 = iVar9 + ((uint)cVar7.field_0 >> 8 & 0xff);
        uVar19 = iVar9 + uVar24;
        uVar16 = 0xff;
        if (uVar20 < 0xff) {
          uVar16 = uVar20;
        }
        uVar22 = 0xff;
        if (uVar21 < 0xff) {
          uVar22 = uVar21;
        }
        uVar23 = 0xff;
        if (uVar19 < 0xff) {
          uVar23 = uVar19;
        }
        if ((int)uVar19 < 0) {
          uVar23 = 0;
        }
        if ((int)uVar21 < 0) {
          uVar22 = 0;
        }
        if ((int)uVar20 < 0) {
          uVar16 = 0;
        }
        block_colors[lVar13].field_0 =
             (anon_union_4_2_6eba8969_for_color_rgba_0)
             (uVar16 + (uVar22 << 8 | uVar23 << 0x10) + -0x1000000);
        block_inten[lVar13] = uVar16 + uVar22 + uVar23;
      }
      block_inten_midpoints[0] = block_inten[1] + block_inten[0];
      block_inten_midpoints[1] = block_inten[1] + block_inten[2];
      block_inten_midpoints[2] = block_inten[2] + block_inten[3];
      puVar4 = this->m_pSorted_luma;
      c1 = this->m_pParams->m_pSrc_pixels;
      uVar16 = puVar4[uVar2 - 1];
      uVar24 = uVar26;
      if (cVar1 == '\0') {
        if (uVar16 * 2 < block_inten_midpoints[0]) {
          uVar19 = block_inten[0] - uVar16;
          if (uVar16 <= block_inten[0] && uVar19 != 0) {
            uVar16 = -uVar19;
            if (0 < (int)uVar19) {
              uVar16 = uVar19;
            }
            if (trial_solution->m_error <= (ulong)uVar16) goto LAB_00222fda;
          }
          puVar10 = vector<unsigned_char>::operator[](this_00,0);
          early_out_err = uVar17;
          memset(puVar10,0,uVar17);
          uVar18 = 0;
          this = peVar25;
          while (bVar5 = uVar17 != 0, uVar17 = uVar17 - 1, bVar5) {
            iVar9 = color_distance(block_colors,c1,false);
            uVar18 = uVar18 + (long)iVar9;
            c1 = c1 + 1;
          }
        }
        else {
          uVar16 = *puVar4;
          if (uVar16 * 2 < block_inten_midpoints[2]) {
            uVar18 = 0;
            uVar24 = 0;
            for (uVar14 = 0; early_out_err = uVar17, this = peVar25, uVar14 != uVar17;
                uVar14 = uVar14 + 1) {
              while (block_inten_midpoints[uVar24] <= peVar25->m_pSorted_luma[uVar14] * 2) {
                uVar24 = uVar24 + 1;
                if (2 < uVar24) {
                  uVar17 = uVar14 & 0xffffffff;
                  goto LAB_00222f37;
                }
              }
              uVar16 = peVar25->m_pSorted_luma_indices[uVar14];
              puVar10 = vector<unsigned_char>::operator[](this_00,(ulong)uVar16);
              *puVar10 = (uchar)uVar24;
              iVar9 = color_distance(block_colors + uVar24,c1 + uVar16,false);
              uVar18 = uVar18 + (long)iVar9;
            }
LAB_00222f37:
            for (; uVar17 < early_out_err; uVar17 = uVar17 + 1) {
              uVar24 = this->m_pSorted_luma_indices[uVar17];
              puVar10 = vector<unsigned_char>::operator[](this_00,(ulong)uVar24);
              *puVar10 = '\x03';
              iVar9 = color_distance(block_colors + 3,c1 + uVar24,false);
              uVar18 = uVar18 + (long)iVar9;
            }
          }
          else {
            uVar19 = uVar16 - block_inten[3];
            if (block_inten[3] <= uVar16 && uVar19 != 0) {
              uVar16 = -uVar19;
              if (0 < (int)uVar19) {
                uVar16 = uVar19;
              }
              if (trial_solution->m_error <= (ulong)uVar16) goto LAB_00222fda;
            }
            puVar10 = vector<unsigned_char>::operator[](this_00,0);
            early_out_err = uVar17;
            memset(puVar10,3,uVar17);
            uVar18 = 0;
            this = peVar25;
            while (bVar5 = uVar17 != 0, uVar17 = uVar17 - 1, bVar5) {
              iVar9 = color_distance(block_colors + 3,c1,false);
              uVar18 = uVar18 + (long)iVar9;
              c1 = c1 + 1;
            }
          }
        }
LAB_00222f91:
        uVar24 = uVar26;
        uVar17 = early_out_err;
        peVar25 = this;
        if (uVar18 < trial_solution->m_error) {
          trial_solution->m_error = uVar18;
          (trial_solution->m_coords).m_inten_table = uVar12;
          vector<unsigned_char>::swap(&trial_solution->m_selectors,this_00);
          trial_solution->m_valid = true;
          uVar17 = early_out_err;
          peVar25 = this;
          if (uVar18 == 0) break;
        }
      }
      else {
        if (block_inten_midpoints[0] <= uVar16 * 2) {
          uVar16 = *puVar4;
          if (uVar16 * 2 < block_inten_midpoints[2]) {
            if (g_cpu_supports_sse41 == '\0') {
              uVar24 = 0;
              uVar18 = 0;
              for (uVar14 = 0; early_out_err = uVar17, this = peVar25, uVar14 != uVar17;
                  uVar14 = uVar14 + 1) {
                while (block_inten_midpoints[uVar24] <= peVar25->m_pSorted_luma[uVar14] * 2) {
                  uVar24 = uVar24 + 1;
                  if (2 < uVar24) {
                    uVar17 = uVar14 & 0xffffffff;
                    goto LAB_00222f86;
                  }
                }
                uVar16 = peVar25->m_pSorted_luma_indices[uVar14];
                puVar10 = vector<unsigned_char>::operator[](this_00,(ulong)uVar16);
                *puVar10 = (uchar)uVar24;
                uVar8 = color_distance(true,block_colors + uVar24,c1 + uVar16,false);
                uVar18 = uVar18 + uVar8;
              }
LAB_00222f86:
              for (; uVar17 < early_out_err; uVar17 = uVar17 + 1) {
                uVar24 = this->m_pSorted_luma_indices[uVar17];
                puVar10 = vector<unsigned_char>::operator[](this_00,(ulong)uVar24);
                *puVar10 = '\x03';
                uVar8 = color_distance(true,block_colors + 3,c1 + uVar24,false);
                uVar18 = uVar18 + uVar8;
              }
            }
            else {
              uVar14 = 0;
              early_out_err = uVar17;
              for (uVar18 = 0; uVar17 = early_out_err, this = peVar25, uVar18 != early_out_err;
                  uVar18 = uVar18 + 1) {
                while (block_inten_midpoints[uVar14] <= peVar25->m_pSorted_luma[uVar18] * 2) {
                  uVar24 = (int)uVar14 + 1;
                  uVar14 = (ulong)uVar24;
                  if (2 < uVar24) {
                    uVar17 = uVar18 & 0xffffffff;
                    goto LAB_00222e96;
                  }
                }
                puVar10 = vector<unsigned_char>::operator[]
                                    (this_00,(ulong)peVar25->m_pSorted_luma_indices[uVar18]);
                *puVar10 = (uchar)uVar14;
              }
LAB_00222e96:
              for (; uVar17 < early_out_err; uVar17 = uVar17 + 1) {
                puVar10 = vector<unsigned_char>::operator[]
                                    (this_00,(ulong)peVar25->m_pSorted_luma_indices[uVar17]);
                *puVar10 = '\x03';
              }
              vector<unsigned_char>::operator[](this_00,0);
              perceptual_distance_rgb_4_N_sse41
                        ((int64_t *)block_colors._0_8_,(uint8_t *)CONCAT44(uVar26,uVar12),
                         (color_rgba *)this,(color_rgba *)this_00,0,early_out_err);
              uVar18 = block_error;
            }
          }
          else {
            uVar19 = uVar16 - block_inten[3];
            if (block_inten[3] <= uVar16 && uVar19 != 0) {
              uVar16 = -uVar19;
              if (0 < (int)uVar19) {
                uVar16 = uVar19;
              }
              if (trial_solution->m_error <= (ulong)uVar16) goto LAB_00222fda;
            }
            puVar10 = vector<unsigned_char>::operator[](this_00,0);
            early_out_err = uVar17;
            memset(puVar10,3,uVar17);
            uVar18 = 0;
            this = peVar25;
            while (bVar5 = uVar17 != 0, uVar17 = uVar17 - 1, bVar5) {
              uVar8 = color_distance(true,block_colors + 3,c1,false);
              uVar18 = uVar18 + uVar8;
              c1 = c1 + 1;
            }
          }
          goto LAB_00222f91;
        }
        uVar19 = block_inten[0] - uVar16;
        if (block_inten[0] < uVar16 || uVar19 == 0) {
LAB_00222ba4:
          puVar10 = vector<unsigned_char>::operator[](this_00,0);
          early_out_err = uVar17;
          memset(puVar10,0,uVar17);
          uVar18 = 0;
          this = peVar25;
          while (bVar5 = uVar17 != 0, uVar17 = uVar17 - 1, bVar5) {
            uVar8 = color_distance(true,block_colors,c1,false);
            uVar18 = uVar18 + uVar8;
            c1 = c1 + 1;
          }
          goto LAB_00222f91;
        }
        uVar16 = -uVar19;
        if (0 < (int)uVar19) {
          uVar16 = uVar19;
        }
        if ((ulong)uVar16 < trial_solution->m_error) goto LAB_00222ba4;
      }
LAB_00222fda:
    }
    (trial_solution->m_coords).m_unscaled_color.field_0 = (coords->m_unscaled_color).field_0;
    (trial_solution->m_coords).m_color4 = this->m_pParams->m_use_color4;
    if ((pBest_solution != (potential_solution *)0x0) &&
       (trial_solution->m_error < pBest_solution->m_error)) {
      potential_solution::operator=(pBest_solution,trial_solution);
      return true;
    }
  }
  return false;
}

Assistant:

bool etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution)
	{
		if (!check_for_redundant_solution(coords))
			return false;

#if BASISU_DEBUG_ETC_ENCODER_DEEPER
		printf("Eval solution fast: %u %u %u\n", coords.m_unscaled_color.r, coords.m_unscaled_color.g, coords.m_unscaled_color.b);
#endif

		if (m_pParams->m_constrain_against_base_color5)
		{
			const int dr = (int)coords.m_unscaled_color.r - (int)m_pParams->m_base_color5.r;
			const int dg = (int)coords.m_unscaled_color.g - (int)m_pParams->m_base_color5.g;
			const int db = (int)coords.m_unscaled_color.b - (int)m_pParams->m_base_color5.b;

			if ((minimum(dr, dg, db) < cETC1ColorDeltaMin) || (maximum(dr, dg, db) > cETC1ColorDeltaMax))
			{
				trial_solution.m_valid = false;

#if BASISU_DEBUG_ETC_ENCODER_DEEPER
				printf("Eval failed due to constraint from %u %u %u\n", m_pParams->m_base_color5.r, m_pParams->m_base_color5.g, m_pParams->m_base_color5.b);
#endif
				return false;
			}
		}

		const color_rgba base_color(coords.get_scaled_color());
		
		const uint32_t n = m_pParams->m_num_src_pixels;
		assert(trial_solution.m_selectors.size() == n);

		trial_solution.m_error = UINT64_MAX;
								
		const bool perceptual = (m_pParams->m_quality == cETCQualityFast) ? false : m_pParams->m_perceptual;
				
		for (int inten_table = cETC1IntenModifierValues - 1; inten_table >= 0; --inten_table)
		{
			const int* pInten_table = g_etc1_inten_tables[inten_table];

			uint32_t block_inten[4];
			color_rgba block_colors[4];
			for (uint32_t s = 0; s < 4; s++)
			{
				const int yd = pInten_table[s];
				color_rgba block_color(base_color.r + yd, base_color.g + yd, base_color.b + yd, 255);
				block_colors[s] = block_color;
				block_inten[s] = block_color.r + block_color.g + block_color.b;
			}

			// evaluate_solution_fast() enforces/assumes a total ordering of the input colors along the intensity (1,1,1) axis to more quickly classify the inputs to selectors.
			// The inputs colors have been presorted along the projection onto this axis, and ETC1 block colors are always ordered along the intensity axis, so this classification is fast.
			// 0   1   2   3
			//   01  12  23
			const uint32_t block_inten_midpoints[3] = { block_inten[0] + block_inten[1], block_inten[1] + block_inten[2], block_inten[2] + block_inten[3] };
															
			uint64_t total_error = 0;
			const color_rgba* pSrc_pixels = m_pParams->m_pSrc_pixels;
						
			if (perceptual)
			{
				if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0])
				{
					if (block_inten[0] > m_pSorted_luma[n - 1])
					{
						const uint32_t min_error = iabs((int)block_inten[0] - (int)m_pSorted_luma[n - 1]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 0, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(true, block_colors[0], pSrc_pixels[c], false);
				}
				else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2])
				{
					if (m_pSorted_luma[0] > block_inten[3])
					{
						const uint32_t min_error = iabs((int)m_pSorted_luma[0] - (int)block_inten[3]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 3, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(true, block_colors[3], pSrc_pixels[c], false);
				}
				else
				{
					if (!g_cpu_supports_sse41)
					{
						uint32_t cur_selector = 0, c;
						for (c = 0; c < n; c++)
						{
							const uint32_t y = m_pSorted_luma[c];
							while ((y * 2) >= block_inten_midpoints[cur_selector])
								if (++cur_selector > 2)
									goto done;
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = static_cast<uint8_t>(cur_selector);
							total_error += color_distance(true, block_colors[cur_selector], pSrc_pixels[sorted_pixel_index], false);
						}
					done:
						while (c < n)
						{
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = 3;
							total_error += color_distance(true, block_colors[3], pSrc_pixels[sorted_pixel_index], false);
							++c;
						}
					}
					else
					{
#if BASISU_SUPPORT_SSE
						uint32_t cur_selector = 0, c;

						for (c = 0; c < n; c++)
						{
							const uint32_t y = m_pSorted_luma[c];
							while ((y * 2) >= block_inten_midpoints[cur_selector])
							{
								if (++cur_selector > 2)
									goto done3;
							}
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = static_cast<uint8_t>(cur_selector);
						}
					done3:

						while (c < n)
						{
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = 3;
							++c;
						}

						int64_t block_error;
						perceptual_distance_rgb_4_N_sse41(&block_error, &m_temp_selectors[0], block_colors, pSrc_pixels, n, INT64_MAX);
						total_error += block_error;
#endif
					}
				}
			}
			else
			{
				if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0])
				{
					if (block_inten[0] > m_pSorted_luma[n - 1])
					{
						const uint32_t min_error = iabs((int)block_inten[0] - (int)m_pSorted_luma[n - 1]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 0, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(block_colors[0], pSrc_pixels[c], false);
				}
				else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2])
				{
					if (m_pSorted_luma[0] > block_inten[3])
					{
						const uint32_t min_error = iabs((int)m_pSorted_luma[0] - (int)block_inten[3]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 3, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(block_colors[3], pSrc_pixels[c], false);
				}
				else
				{
					uint32_t cur_selector = 0, c;
					for (c = 0; c < n; c++)
					{
						const uint32_t y = m_pSorted_luma[c];
						while ((y * 2) >= block_inten_midpoints[cur_selector])
							if (++cur_selector > 2)
								goto done2;
						const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
						m_temp_selectors[sorted_pixel_index] = static_cast<uint8_t>(cur_selector);
						total_error += color_distance(block_colors[cur_selector], pSrc_pixels[sorted_pixel_index], false);
					}
				done2:
					while (c < n)
					{
						const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
						m_temp_selectors[sorted_pixel_index] = 3;
						total_error += color_distance(block_colors[3], pSrc_pixels[sorted_pixel_index], false);
						++c;
					}
				}
			}

			if (total_error < trial_solution.m_error)
			{
				trial_solution.m_error = total_error;
				trial_solution.m_coords.m_inten_table = inten_table;
				trial_solution.m_selectors.swap(m_temp_selectors);
				trial_solution.m_valid = true;
				if (!total_error)
					break;
			}
		}
		trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
		trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

#if BASISU_DEBUG_ETC_ENCODER_DEEPER
		printf("Eval done: %u error: %I64u best error so far: %I64u\n", (trial_solution.m_error < pBest_solution->m_error), trial_solution.m_error, pBest_solution->m_error);
#endif

		bool success = false;
		if (pBest_solution)
		{
			if (trial_solution.m_error < pBest_solution->m_error)
			{
				*pBest_solution = trial_solution;
				success = true;
			}
		}

		return success;
	}